

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.c
# Opt level: O0

void fits_setup_shape(RgnShape *newShape)

{
  int iVar1;
  long in_RDI;
  double dVar2;
  double dVar3;
  int i;
  double *coords;
  double R;
  double Y;
  double X;
  double local_48;
  double local_40;
  int local_2c;
  double *local_28;
  double local_20;
  
  if (*(int *)(in_RDI + 4) == 0xb) {
    local_28 = *(double **)(in_RDI + 0x38);
  }
  else {
    local_28 = (double *)(in_RDI + 0x30);
  }
  switch(*(undefined4 *)(in_RDI + 4)) {
  case 1:
    local_48 = local_28[2] - *local_28;
    local_40 = local_28[3] - local_28[1];
    dVar3 = sqrt(local_48 * local_48 + local_40 * local_40);
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      local_40 = local_40 / dVar3;
    }
    else {
      local_40 = 0.0;
    }
    *(double *)(in_RDI + 0x88) = local_40;
    if ((dVar3 != 0.0) || (NAN(dVar3))) {
      local_48 = local_48 / dVar3;
    }
    else {
      local_48 = 1.0;
    }
    *(double *)(in_RDI + 0x90) = local_48;
    *(double *)(in_RDI + 0x98) = dVar3 + 0.5;
    break;
  case 2:
    *(double *)(in_RDI + 0x98) = local_28[2] * local_28[2];
    break;
  case 3:
    *(double *)(in_RDI + 0x98) = local_28[2] * local_28[2];
    *(double *)(in_RDI + 0xa0) = local_28[3] * local_28[3];
    break;
  case 4:
    dVar3 = sin((local_28[4] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x88) = dVar3;
    dVar3 = cos((local_28[4] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x90) = dVar3;
    break;
  case 5:
    dVar3 = sin((local_28[6] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x98) = dVar3;
    dVar3 = cos((local_28[6] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0xa0) = dVar3;
    dVar3 = sin((local_28[7] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x88) = dVar3;
    dVar3 = cos((local_28[7] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x90) = dVar3;
    break;
  case 6:
    dVar3 = sin((local_28[4] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x88) = dVar3;
    dVar3 = cos((local_28[4] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x90) = dVar3;
    break;
  case 7:
    dVar3 = sin((local_28[6] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x98) = dVar3;
    dVar3 = cos((local_28[6] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0xa0) = dVar3;
    dVar3 = sin((local_28[7] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x88) = dVar3;
    dVar3 = cos((local_28[7] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x90) = dVar3;
    break;
  case 8:
    dVar3 = sin((local_28[4] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x88) = dVar3;
    dVar3 = cos((local_28[4] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x90) = dVar3;
    dVar3 = (local_28[2] - *local_28) * 0.5;
    dVar2 = (local_28[3] - local_28[1]) * 0.5;
    *(double *)(in_RDI + 0x98) =
         ABS(dVar3 * *(double *)(in_RDI + 0x90) + dVar2 * *(double *)(in_RDI + 0x88));
    *(double *)(in_RDI + 0xa0) =
         ABS(dVar2 * *(double *)(in_RDI + 0x90) + -(dVar3 * *(double *)(in_RDI + 0x88)));
    *(double *)(in_RDI + 0x58) = (local_28[2] + *local_28) * 0.5;
    *(double *)(in_RDI + 0x60) = (local_28[3] + local_28[1]) * 0.5;
    break;
  case 9:
    dVar3 = sin((local_28[4] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x88) = dVar3;
    dVar3 = cos((local_28[4] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x90) = dVar3;
    break;
  case 10:
    while (180.0 < local_28[2]) {
      local_28[2] = local_28[2] - 360.0;
    }
    while (local_28[2] <= -180.0) {
      local_28[2] = local_28[2] + 360.0;
    }
    while (180.0 < local_28[3]) {
      local_28[3] = local_28[3] - 360.0;
    }
    while (local_28[3] <= -180.0) {
      local_28[3] = local_28[3] + 360.0;
    }
    break;
  default:
    break;
  case 0xc:
    while (180.0 < local_28[2]) {
      local_28[2] = local_28[2] - 360.0;
    }
    while (local_28[2] <= -180.0) {
      local_28[2] = local_28[2] + 360.0;
    }
    while (180.0 < local_28[3]) {
      local_28[3] = local_28[3] - 360.0;
    }
    while (local_28[3] <= -180.0) {
      local_28[3] = local_28[3] + 360.0;
    }
    *(double *)(in_RDI + 0x98) = *(double *)(in_RDI + 0x58) * *(double *)(in_RDI + 0x58);
    *(double *)(in_RDI + 0xa0) = *(double *)(in_RDI + 0x60) * *(double *)(in_RDI + 0x60);
    break;
  case 0xd:
  case 0xe:
    while (180.0 < local_28[2]) {
      local_28[2] = local_28[2] - 360.0;
    }
    while (local_28[2] <= -180.0) {
      local_28[2] = local_28[2] + 360.0;
    }
    while (180.0 < local_28[3]) {
      local_28[3] = local_28[3] - 360.0;
    }
    while (local_28[3] <= -180.0) {
      local_28[3] = local_28[3] + 360.0;
    }
    dVar3 = sin((local_28[10] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x88) = dVar3;
    dVar3 = cos((local_28[10] / 180.0) * 3.141592653589793);
    *(double *)(in_RDI + 0x90) = dVar3;
  }
  local_20 = -1.0;
  switch(*(undefined4 *)(in_RDI + 4)) {
  case 0:
    local_20 = 1.0;
    break;
  default:
    break;
  case 2:
    local_20 = local_28[2];
    break;
  case 3:
    local_20 = local_28[3];
    break;
  case 4:
    if (local_28[2] < local_28[3] || local_28[2] == local_28[3]) {
      local_20 = local_28[3];
    }
    else {
      local_20 = local_28[2];
    }
    break;
  case 5:
    if (local_28[4] < local_28[5] || local_28[4] == local_28[5]) {
      local_20 = local_28[5];
    }
    else {
      local_20 = local_28[4];
    }
    break;
  case 6:
    local_20 = sqrt(local_28[2] * local_28[2] + local_28[3] * local_28[3]);
    local_20 = local_20 / 2.0;
    break;
  case 7:
    local_20 = sqrt(local_28[4] * local_28[5] + local_28[4] * local_28[5]);
    local_20 = local_20 / 2.0;
    break;
  case 9:
    if (local_28[2] < local_28[3] || local_28[2] == local_28[3]) {
      local_20 = local_28[3];
    }
    else {
      local_20 = local_28[2];
    }
    local_20 = local_20 / 2.0;
    break;
  case 0xc:
    local_20 = local_28[6];
    break;
  case 0xd:
    if (local_28[7] < local_28[8] || local_28[7] == local_28[8]) {
      local_20 = local_28[8];
    }
    else {
      local_20 = local_28[7];
    }
    break;
  case 0xe:
    local_20 = sqrt(local_28[7] * local_28[8] + local_28[7] * local_28[8]);
    local_20 = local_20 / 2.0;
  }
  if (0.0 < local_20) {
    *(double *)(in_RDI + 0x10) = *local_28 - local_20;
    *(double *)(in_RDI + 0x18) = *local_28 + local_20;
    *(double *)(in_RDI + 0x20) = local_28[1] - local_20;
    *(double *)(in_RDI + 0x28) = local_28[1] + local_20;
  }
  else {
    switch(*(undefined4 *)(in_RDI + 4)) {
    case 1:
      if (*local_28 < local_28[2] || *local_28 == local_28[2]) {
        *(double *)(in_RDI + 0x10) = *local_28;
        *(double *)(in_RDI + 0x18) = local_28[2];
      }
      else {
        *(double *)(in_RDI + 0x10) = local_28[2];
        *(double *)(in_RDI + 0x18) = *local_28;
      }
      if (local_28[1] < local_28[3] || local_28[1] == local_28[3]) {
        *(double *)(in_RDI + 0x20) = local_28[1];
        *(double *)(in_RDI + 0x28) = local_28[3];
      }
      else {
        *(double *)(in_RDI + 0x20) = local_28[3];
        *(double *)(in_RDI + 0x28) = local_28[1];
      }
      break;
    default:
      break;
    case 8:
      dVar3 = sqrt((local_28[5] - *local_28) * (local_28[5] - *local_28) +
                   (local_28[6] - local_28[1]) * (local_28[6] - local_28[1]));
      *(double *)(in_RDI + 0x10) = local_28[5] - dVar3;
      *(double *)(in_RDI + 0x18) = local_28[5] + dVar3;
      *(double *)(in_RDI + 0x20) = local_28[6] - dVar3;
      *(double *)(in_RDI + 0x28) = local_28[6] + dVar3;
      break;
    case 10:
      *(undefined8 *)(in_RDI + 0x10) = 0x3ff0000000000000;
      *(undefined8 *)(in_RDI + 0x18) = 0xbff0000000000000;
      *(undefined8 *)(in_RDI + 0x20) = 0x3ff0000000000000;
      *(undefined8 *)(in_RDI + 0x28) = 0xbff0000000000000;
      break;
    case 0xb:
      *(double *)(in_RDI + 0x10) = *local_28;
      *(double *)(in_RDI + 0x18) = *local_28;
      *(double *)(in_RDI + 0x20) = local_28[1];
      *(double *)(in_RDI + 0x28) = local_28[1];
      for (local_2c = 2; local_2c < *(int *)(in_RDI + 0x30); local_2c = local_2c + 2) {
        if (local_28[local_2c] <= *(double *)(in_RDI + 0x10) &&
            *(double *)(in_RDI + 0x10) != local_28[local_2c]) {
          *(double *)(in_RDI + 0x10) = local_28[local_2c];
        }
        if (*(double *)(in_RDI + 0x18) < local_28[local_2c]) {
          *(double *)(in_RDI + 0x18) = local_28[local_2c];
        }
        iVar1 = local_2c + 1;
        if (local_28[iVar1] <= *(double *)(in_RDI + 0x20) &&
            *(double *)(in_RDI + 0x20) != local_28[iVar1]) {
          *(double *)(in_RDI + 0x20) = local_28[iVar1];
        }
        if (*(double *)(in_RDI + 0x28) < local_28[iVar1]) {
          *(double *)(in_RDI + 0x28) = local_28[iVar1];
        }
      }
    }
  }
  return;
}

Assistant:

void fits_setup_shape ( RgnShape *newShape)
{
/* Perform some useful calculations now to speed up filter later             */

  double X, Y, R;
  double *coords;
  int i;

  if ( newShape->shape == poly_rgn ) {
    coords = newShape->param.poly.Pts;
  } else {
    coords = newShape->param.gen.p;
  }

  switch( newShape->shape ) {
  case circle_rgn:
    newShape->param.gen.a = coords[2] * coords[2];
    break;
  case annulus_rgn:
    newShape->param.gen.a = coords[2] * coords[2];
    newShape->param.gen.b = coords[3] * coords[3];
    break;
  case sector_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    break;
  case ellipse_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case elliptannulus_rgn:
    newShape->param.gen.a    = sin( myPI * (coords[6] / 180.0) );
    newShape->param.gen.b    = cos( myPI * (coords[6] / 180.0) );
    newShape->param.gen.sinT = sin( myPI * (coords[7] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[7] / 180.0) );
    break;
  case box_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case boxannulus_rgn:
    newShape->param.gen.a    = sin( myPI * (coords[6] / 180.0) );
    newShape->param.gen.b    = cos( myPI * (coords[6] / 180.0) );
    newShape->param.gen.sinT = sin( myPI * (coords[7] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[7] / 180.0) );
    break;
  case rectangle_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    X = 0.5 * ( coords[2]-coords[0] );
    Y = 0.5 * ( coords[3]-coords[1] );
    newShape->param.gen.a = fabs( X * newShape->param.gen.cosT
				  + Y * newShape->param.gen.sinT );
    newShape->param.gen.b = fabs( Y * newShape->param.gen.cosT
				  - X * newShape->param.gen.sinT );
    newShape->param.gen.p[5] = 0.5 * ( coords[2]+coords[0] );
    newShape->param.gen.p[6] = 0.5 * ( coords[3]+coords[1] );
    break;
  case diamond_rgn:
    newShape->param.gen.sinT = sin( myPI * (coords[4] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[4] / 180.0) );
    break;
  case line_rgn:
    X = coords[2] - coords[0];
    Y = coords[3] - coords[1];
    R = sqrt( X*X + Y*Y );
    newShape->param.gen.sinT = ( R ? Y/R : 0.0 );
    newShape->param.gen.cosT = ( R ? X/R : 1.0 );
    newShape->param.gen.a    = R + 0.5;
    break;
  case panda_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    newShape->param.gen.a = newShape->param.gen.p[5]*newShape->param.gen.p[5];
    newShape->param.gen.b = newShape->param.gen.p[6]*newShape->param.gen.p[6];
    break;
  case epanda_rgn:
  case bpanda_rgn:
    while( coords[2]> 180.0 ) coords[2] -= 360.0;
    while( coords[2]<=-180.0 ) coords[2] += 360.0;
    while( coords[3]> 180.0 ) coords[3] -= 360.0;
    while( coords[3]<=-180.0 ) coords[3] += 360.0;
    newShape->param.gen.sinT = sin( myPI * (coords[10] / 180.0) );
    newShape->param.gen.cosT = cos( myPI * (coords[10] / 180.0) );
    break;
  default:
    break;
  }

  /*  Set the xmin, xmax, ymin, ymax elements of the RgnShape structure */

  /* For everything which has first two parameters as center position just */
  /* find a circle that encompasses the region and use it to set the       */
  /* bounding box                                                          */

  R = -1.0;

  switch ( newShape->shape ) {

  case circle_rgn:
    R = coords[2];
    break;

  case annulus_rgn:
    R = coords[3];
    break;

  case ellipse_rgn:
    if ( coords[2] > coords[3] ) {
      R = coords[2];
    } else {
      R = coords[3];
    }
    break;

  case elliptannulus_rgn:
    if ( coords[4] > coords[5] ) {
      R = coords[4];
    } else {
      R = coords[5];
    }
    break;

  case box_rgn:
    R = sqrt(coords[2]*coords[2]+
	     coords[3]*coords[3])/2.0;
    break;

  case boxannulus_rgn:
    R = sqrt(coords[4]*coords[5]+
	     coords[4]*coords[5])/2.0;
    break;

  case diamond_rgn:
    if ( coords[2] > coords[3] ) {
      R = coords[2]/2.0;
    } else {
      R = coords[3]/2.0;
    }
    break;
    
  case point_rgn:
    R = 1.0;
    break;

  case panda_rgn:
    R = coords[6];
    break;

  case epanda_rgn:
    if ( coords[7] > coords[8] ) {
      R = coords[7];
    } else {
      R = coords[8];
    }
    break;

  case bpanda_rgn:
    R = sqrt(coords[7]*coords[8]+
	     coords[7]*coords[8])/2.0;
    break;

  default:
    break;
  }

  if ( R > 0.0 ) {

    newShape->xmin = coords[0] - R;
    newShape->xmax = coords[0] + R;
    newShape->ymin = coords[1] - R;
    newShape->ymax = coords[1] + R;

    return;

  }

  /* Now do the rest of the shapes that require individual methods */

  switch ( newShape->shape ) {

  case rectangle_rgn:
    R = sqrt((coords[5]-coords[0])*(coords[5]-coords[0])+
	     (coords[6]-coords[1])*(coords[6]-coords[1]));
    newShape->xmin = coords[5] - R;
    newShape->xmax = coords[5] + R;
    newShape->ymin = coords[6] - R;
    newShape->ymax = coords[6] + R;
    break;

  case poly_rgn:
    newShape->xmin = coords[0];
    newShape->xmax = coords[0];
    newShape->ymin = coords[1];
    newShape->ymax = coords[1];
    for( i=2; i < newShape->param.poly.nPts; ) {
      if( newShape->xmin > coords[i] ) /* Min X */
	newShape->xmin = coords[i];
      if( newShape->xmax < coords[i] ) /* Max X */
	newShape->xmax = coords[i];
      i++;
      if( newShape->ymin > coords[i] ) /* Min Y */
	newShape->ymin = coords[i];
      if( newShape->ymax < coords[i] ) /* Max Y */
	newShape->ymax = coords[i];
      i++;
    }
    break;

  case line_rgn:
    if ( coords[0] > coords[2] ) {
      newShape->xmin = coords[2];
      newShape->xmax = coords[0];
    } else {
      newShape->xmin = coords[0];
      newShape->xmax = coords[2];
    }
    if ( coords[1] > coords[3] ) {
      newShape->ymin = coords[3];
      newShape->ymax = coords[1];
    } else {
      newShape->ymin = coords[1];
      newShape->ymax = coords[3];
    }

    break;

    /* sector doesn't have min and max so indicate by setting max < min */

  case sector_rgn:
    newShape->xmin = 1.0;
    newShape->xmax = -1.0;
    newShape->ymin = 1.0;
    newShape->ymax = -1.0;
    break;

  default:
    break;
  }

  return;

}